

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest14_15::testDraw
          (FunctionalTest14_15 *this,GLuint routine_configuration,vec4<unsigned_int> *uni_input,
          vec4<unsigned_int> *expected_routine_1_result,
          vec4<unsigned_int> *expected_routine_2_result)

{
  ostringstream *poVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  byte bVar10;
  FunctionalTest14_15 *pFVar11;
  int iVar12;
  deUint32 dVar13;
  undefined4 extraout_var;
  uint *puVar15;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  GLuint subroutine_indices [2];
  MessageBuilder message;
  uint local_1e0 [2];
  vec4<unsigned_int> local_1d8;
  vec4<unsigned_int> local_1c8;
  FunctionalTest14_15 *local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar14;
  
  iVar12 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar14 = CONCAT44(extraout_var,iVar12);
  (**(code **)(lVar14 + 0x15c0))
            (this->m_uniform_location,uni_input->m_x,uni_input->m_y,uni_input->m_z,uni_input->m_w);
  dVar13 = (**(code **)(lVar14 + 0x800))();
  glu::checkError(dVar13,"Uniform4f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1e9a);
  local_1e0[this->m_subroutine_uniform_locations[0]] =
       this->m_subroutine_indices[0][routine_configuration];
  local_1b8 = this;
  local_1e0[this->m_subroutine_uniform_locations[1]] =
       this->m_initial_subroutine_uniform_locations[(ulong)routine_configuration - 3];
  (**(code **)(lVar14 + 0x1668))(0x8b31,2,local_1e0);
  dVar13 = (**(code **)(lVar14 + 0x800))();
  glu::checkError(dVar13,"UniformSubroutinesuiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1ea6);
  (**(code **)(lVar14 + 0x30))(0);
  dVar13 = (**(code **)(lVar14 + 0x800))();
  glu::checkError(dVar13,"BeginTransformFeedback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1eaa);
  (**(code **)(lVar14 + 0x538))(0,0,1);
  dVar13 = (**(code **)(lVar14 + 0x800))();
  glu::checkError(dVar13,"DrawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1ead);
  (**(code **)(lVar14 + 0x638))();
  dVar13 = (**(code **)(lVar14 + 0x800))();
  glu::checkError(dVar13,"EndTransformFeedback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1eb0);
  puVar15 = (uint *)(**(code **)(lVar14 + 0xcf8))(0x8c8e,35000);
  dVar13 = (**(code **)(lVar14 + 0x800))();
  glu::checkError(dVar13,"MapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1eb4);
  uVar2 = *puVar15;
  uVar3 = puVar15[1];
  uVar4 = puVar15[2];
  uVar5 = puVar15[3];
  uVar6 = puVar15[4];
  uVar7 = puVar15[5];
  uVar8 = puVar15[6];
  uVar9 = puVar15[7];
  local_1d8.m_x = uVar6;
  local_1d8.m_y = uVar7;
  local_1d8.m_z = uVar8;
  local_1d8.m_w = uVar9;
  local_1c8.m_x = uVar2;
  local_1c8.m_y = uVar3;
  local_1c8.m_z = uVar4;
  local_1c8.m_w = uVar5;
  (**(code **)(lVar14 + 0x1670))(0x8c8e);
  dVar13 = (**(code **)(lVar14 + 0x800))();
  glu::checkError(dVar13,"UnmapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1ec5);
  pFVar11 = local_1b8;
  auVar16._0_4_ = -(uint)(uVar2 == expected_routine_1_result->m_x);
  auVar16._4_4_ = -(uint)(uVar3 == expected_routine_1_result->m_y);
  auVar16._8_4_ = -(uint)(uVar4 == expected_routine_1_result->m_z);
  auVar16._12_4_ = -(uint)(uVar5 == expected_routine_1_result->m_w);
  auVar17._0_4_ = -(uint)(uVar6 == expected_routine_2_result->m_x);
  auVar17._4_4_ = -(uint)(uVar7 == expected_routine_2_result->m_y);
  auVar17._8_4_ = -(uint)(uVar8 == expected_routine_2_result->m_z);
  auVar17._12_4_ = -(uint)(uVar9 == expected_routine_2_result->m_w);
  auVar17 = packssdw(auVar16,auVar17);
  auVar17 = packsswb(auVar17,auVar17);
  bVar10 = SUB161(auVar17 >> 7,0) & 1 | (SUB161(auVar17 >> 0xf,0) & 1) << 1 |
           (SUB161(auVar17 >> 0x17,0) & 1) << 2 | (SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
           (SUB161(auVar17 >> 0x27,0) & 1) << 4 | (SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
           (SUB161(auVar17 >> 0x37,0) & 1) << 6 | SUB161(auVar17 >> 0x3f,0) << 7;
  if (bVar10 != 0xff) {
    local_1b0._0_8_ = ((local_1b8->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Error. Invalid result.",0x16);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    local_1b0._0_8_ = ((pFVar11->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Routine_1, result: ",0x13)
    ;
    Utils::vec4<unsigned_int>::log(&local_1c8,__x);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected: ",0xc);
    Utils::vec4<unsigned_int>::log(expected_routine_1_result,__x_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Routine_2, result: ",0x13)
    ;
    Utils::vec4<unsigned_int>::log(&local_1d8,__x_01);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected: ",0xc);
    Utils::vec4<unsigned_int>::log(expected_routine_2_result,__x_02);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
  }
  return bVar10 == 0xff;
}

Assistant:

bool FunctionalTest14_15::testDraw(glw::GLuint routine_configuration, const Utils::vec4<glw::GLuint>& uni_input,
								   const Utils::vec4<glw::GLuint>& expected_routine_1_result,
								   const Utils::vec4<glw::GLuint>& expected_routine_2_result) const
{
	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	bool				  result = true;
	GLuint				  subroutine_indices[2];
	static const GLuint   n_subroutine_uniforms = sizeof(subroutine_indices) / sizeof(subroutine_indices[0]);

	/* Set up input data uniforms */
	gl.uniform4ui(m_uniform_location, uni_input.m_x, uni_input.m_y, uni_input.m_z, uni_input.m_w);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform4f");

	/* Prepare subroutine uniform data */
	for (GLuint i = 0; i < n_subroutine_uniforms; ++i)
	{
		const GLuint location = m_subroutine_uniform_locations[i];

		subroutine_indices[location] = m_subroutine_indices[i][routine_configuration];
	}

	/* Set up subroutine uniforms */
	gl.uniformSubroutinesuiv(GL_VERTEX_SHADER, n_subroutine_uniforms, &subroutine_indices[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UniformSubroutinesuiv");

	/* Execute draw call with transform feedback */
	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BeginTransformFeedback");

	gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArrays");

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "EndTransformFeedback");

	/* Capture results */
	GLuint* feedback_data = (GLuint*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "MapBuffer");

	Utils::vec4<GLuint> routine_1_result;
	Utils::vec4<GLuint> routine_2_result;

	routine_1_result.m_x = feedback_data[0 + 0];
	routine_1_result.m_y = feedback_data[0 + 1];
	routine_1_result.m_z = feedback_data[0 + 2];
	routine_1_result.m_w = feedback_data[0 + 3];

	routine_2_result.m_x = feedback_data[4 + 0];
	routine_2_result.m_y = feedback_data[4 + 1];
	routine_2_result.m_z = feedback_data[4 + 2];
	routine_2_result.m_w = feedback_data[4 + 3];

	/* Unmap buffer */
	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UnmapBuffer");

	/* Verifiy */
	result = result && (routine_1_result == expected_routine_1_result);
	result = result && (routine_2_result == expected_routine_2_result);

	/* Log error if any */
	if (false == result)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Error. Invalid result."
											<< tcu::TestLog::EndMessage;

		tcu::MessageBuilder message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

		message << "Routine_1, result: ";

		routine_1_result.log(message);

		message << ", expected: ";

		expected_routine_1_result.log(message);

		message << "Routine_2, result: ";

		routine_2_result.log(message);

		message << ", expected: ";

		expected_routine_2_result.log(message);

		message << tcu::TestLog::EndMessage;
	}

	/* Done */
	return result;
}